

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::FieldOptions::_InternalParse(FieldOptions *this,char *ptr,ParseContext *ctx)

{
  int number;
  bool bVar1;
  UninterpretedOption *msg;
  uint64 uVar2;
  UnknownFieldSet *this_00;
  uint uVar3;
  char cVar4;
  char *local_50;
  uint32 tag;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  uVar3 = 0;
  local_50 = ptr;
LAB_002c17a4:
LAB_002c17a9:
  bVar1 = internal::ParseContext::Done(ctx,&local_50);
  if (bVar1) goto LAB_002c19d0;
  local_50 = internal::ReadTag(local_50,&tag,0);
  if (local_50 == (char *)0x0) goto LAB_002c19ea;
  cVar4 = (char)tag;
  switch(tag >> 3) {
  case 1:
    if (cVar4 == '\b') {
      uVar2 = internal::ReadVarint(&local_50);
      if (local_50 == (char *)0x0) goto LAB_002c19ea;
      if (2 < (uint)uVar2) {
        this_00 = mutable_unknown_fields(this);
        number = 1;
        goto LAB_002c19bd;
      }
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      this->ctype_ = (uint)uVar2;
      goto LAB_002c17a4;
    }
    break;
  case 2:
    if (cVar4 != '\x10') break;
    uVar3 = uVar3 | 2;
    uVar2 = internal::ReadVarint(&local_50);
    this->packed_ = uVar2 != 0;
    goto joined_r0x002c18da;
  case 3:
    if (cVar4 == '\x18') {
      uVar3 = uVar3 | 8;
      uVar2 = internal::ReadVarint(&local_50);
      this->deprecated_ = uVar2 != 0;
      goto joined_r0x002c18da;
    }
    break;
  case 4:
  case 7:
  case 8:
  case 9:
    break;
  case 5:
    if (cVar4 == '(') {
      uVar3 = uVar3 | 4;
      uVar2 = internal::ReadVarint(&local_50);
      this->lazy_ = uVar2 != 0;
      goto joined_r0x002c18da;
    }
    break;
  case 6:
    if (cVar4 == '0') goto LAB_002c197b;
    break;
  case 10:
    if (cVar4 == 'P') {
      uVar3 = uVar3 | 0x10;
      uVar2 = internal::ReadVarint(&local_50);
      this->weak_ = uVar2 != 0;
      goto joined_r0x002c18da;
    }
    break;
  default:
    if ((tag >> 3 != 999) || (cVar4 != ':')) break;
    local_50 = local_50 + -2;
    do {
      local_50 = local_50 + 2;
      msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                      (&this->uninterpreted_option_);
      local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                           (ctx,msg,local_50);
      if (local_50 == (char *)0x0) goto LAB_002c19ea;
    } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
            (bVar1 = internal::ExpectTag<7994u>(local_50), bVar1));
    goto LAB_002c17a9;
  }
  if (((ulong)tag == 0) || ((tag & 7) == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
    goto LAB_002c19d0;
  }
  if (tag < 8000) {
    local_50 = internal::UnknownFieldParse(tag,local_40,local_50,ctx);
  }
  else {
    local_50 = internal::ExtensionSet::ParseField
                         (local_38,(ulong)tag,local_50,(Message *)_FieldOptions_default_instance_,
                          local_40,ctx);
  }
joined_r0x002c18da:
  if (local_50 == (char *)0x0) goto LAB_002c19ea;
  goto LAB_002c17a9;
LAB_002c197b:
  uVar2 = internal::ReadVarint(&local_50);
  if (local_50 == (char *)0x0) {
LAB_002c19ea:
    local_50 = (char *)0x0;
LAB_002c19d0:
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
    return local_50;
  }
  if ((uint)uVar2 < 3) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
    this->jstype_ = (uint)uVar2;
  }
  else {
    this_00 = mutable_unknown_fields(this);
    number = 6;
LAB_002c19bd:
    UnknownFieldSet::AddVarint(this_00,number,uVar2);
  }
  goto LAB_002c17a4;
}

Assistant:

const char* FieldOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_CType_IsValid(val))) {
            _internal_set_ctype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_CType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(1, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool packed = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_packed(&has_bits);
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool lazy = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_lazy(&has_bits);
          lazy_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_JSType_IsValid(val))) {
            _internal_set_jstype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_JSType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool weak = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_weak(&has_bits);
          weak_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}